

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall
NavierStokesBase::setTimeLevel(NavierStokesBase *this,Real time,Real dt_old,Real dt_new)

{
  amrex::StateData::setTimeLevel
            ((this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start,time,dt_old,dt_new);
  if (have_divu != 0) {
    amrex::StateData::setTimeLevel
              ((this->super_AmrLevel).state.
               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start + Divu_Type,time,dt_old,dt_new);
    if (have_dsdt != 0) {
      amrex::StateData::setTimeLevel
                ((this->super_AmrLevel).state.
                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start + Dsdt_Type,time,dt_old,dt_new);
    }
  }
  amrex::StateData::setTimeLevel
            ((this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start + 1,time - dt_old,dt_old,dt_old);
  amrex::StateData::setTimeLevel
            ((this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start + 2,time - dt_old,dt_old,dt_old);
  return;
}

Assistant:

void
NavierStokesBase::setTimeLevel (Real time,
                                Real dt_old,
                                Real dt_new)
{
    state[State_Type].setTimeLevel(time,dt_old,dt_new);

    if (have_divu)
    {
        state[Divu_Type].setTimeLevel(time,dt_old,dt_new);
        if (have_dsdt)
        {
            state[Dsdt_Type].setTimeLevel(time,dt_old,dt_new);
        }
    }

    state[Press_Type].setTimeLevel(time-dt_old,dt_old,dt_old);

    state[Gradp_Type].setTimeLevel(time-dt_old,dt_old,dt_old);
}